

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  uint32_t result_type_00;
  uint32_t result_id_00;
  string local_98;
  spirv_cross local_78 [32];
  string local_58;
  byte local_31;
  SPIRType *pSStack_30;
  bool forward;
  SPIRType *type;
  char *op_local;
  uint32_t local_18;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)op;
  op_local._4_4_ = op0;
  local_18 = result_id;
  op0_local = result_type;
  _result_id_local = this;
  pSStack_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  local_31 = should_forward(this,op_local._4_4_);
  result_type_00 = op0_local;
  result_id_00 = local_18;
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_78,this,pSStack_30,0);
  to_enclosed_unpacked_expression_abi_cxx11_(&local_98,this,op_local._4_4_,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[2]>
            (&local_58,local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
             (char (*) [2])&type,(char **)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
             (char (*) [2])CONCAT44(result_id_00,result_type_00));
  emit_op(this,result_type_00,result_id_00,&local_58,(bool)(local_31 & 1),false);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)local_78);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,op_local._4_4_);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(type_to_glsl(type), "(", op, to_enclosed_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}